

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O1

void __thiscall WellFounded::killSupport(WellFounded *this,ConjRule *r)

{
  uint uVar1;
  int h;
  uint local_14;
  
  local_14 = r->head;
  if ((((this->support).data[local_14] == r) &&
      (uVar1 = (this->lits).data[local_14].x,
      (uVar1 & 1) * 2 + -1 != (int)sat.assigns.data[(uint)((int)uVar1 >> 1)])) &&
     ((this->no_support_bool).data[local_14] == false)) {
    vec<int>::push((this->no_support).data + (uint)(this->scc_ids).data[local_14],(int *)&local_14);
    (this->no_support_bool).data[local_14] = true;
  }
  return;
}

Assistant:

void killSupport(ConjRule* r) {
		const int h = r->head;
		if (support[h] != r) {
			return;
		}
		if (BoolView(lits[h]).isFalse()) {
			return;
		}
		if (no_support_bool[h]) {
			return;
		}
		no_support[scc_ids[h]].push(h);
		no_support_bool[h] = true;
	}